

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O2

void supdup_send_36bits(Supdup *supdup,unsigned_long_long thirtysix)

{
  ulong in_RAX;
  byte bVar1;
  int i;
  int iVar2;
  undefined7 uStack_38;
  char sixBits;
  
  bVar1 = 0x1e;
  _uStack_38 = in_RAX;
  for (iVar2 = 5; -1 < iVar2; iVar2 = iVar2 + -1) {
    _uStack_38 = CONCAT17((char)(thirtysix >> (bVar1 & 0x3f)),uStack_38) & 0x3fffffffffffffff;
    (*supdup->s->vt->write)(supdup->s,&sixBits,1);
    bVar1 = bVar1 - 6;
  }
  return;
}

Assistant:

static void supdup_send_36bits(Supdup *supdup, unsigned long long thirtysix)
{
    //
    // From RFC734:
    // "Each word is sent through the 8-bit connection as six
    //  6-bit bytes, most-significant first."
    //
    // Split the 36-bit word into 6 6-bit "bytes", packed into
    // 8-bit bytes and send, most-significant byte first.
    //
    for (int i = 5; i >= 0; i--) {
        char sixBits = (thirtysix >> (i * 6)) & 077;
        sk_write(supdup->s, &sixBits, 1);
    }
}